

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int dmy_to_mjd2000_julian(int D,int M,int Y,int *jd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool local_65;
  bool local_59;
  int local_58 [2];
  int offset [13];
  int *jd_local;
  int Y_local;
  int M_local;
  int D_local;
  
  unique0x10000185 = jd;
  memcpy(local_58,&DAT_00219040,0x34);
  if ((((Y != 0) && (0 < M)) && (M < 0xd)) && (0 < D)) {
    iVar3 = offset[(long)M + -2];
    iVar2 = offset[(long)(M + -1) + -2];
    local_59 = false;
    if (M == 2) {
      iVar1 = y(Y);
      local_59 = iVar1 % 4 == 0;
    }
    if (D <= (int)((iVar3 - iVar2) + (uint)local_59)) {
      iVar2 = y(Y);
      iVar3 = y(Y);
      iVar1 = int_div(iVar3,4);
      iVar3 = offset[(long)(M + -1) + -2];
      local_65 = false;
      if (M < 3) {
        iVar4 = y(Y);
        local_65 = iVar4 % 4 == 0;
      }
      *stack0xffffffffffffffe0 = ((D + iVar2 * 0x16d + iVar1 + iVar3) - (uint)local_65) + 0x1a42e2;
      return 0;
    }
  }
  coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",(ulong)(uint)D,(ulong)(uint)M,
                 (ulong)(uint)Y);
  return -1;
}

Assistant:

static int dmy_to_mjd2000_julian(int D, int M, int Y, int *jd)
{
    const int offset[13] = { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334, 365 };

    /* check input */
    if (Y == 0 || M < 1 || M > 12 || D < 1 || D > offset[M] - offset[M - 1] + ((M == 2) && (y(Y) % 4 == 0)))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
        return -1;
    }

    *jd = D + 365 * y(Y) + int_div(y(Y), 4) + offset[M - 1] - ((M <= 2) && (y(Y) % 4 == 0)) + 1721058;

    return 0;
}